

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  byte *pbVar1;
  byte bVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  char_t *s;
  char_t *pcVar5;
  char_t *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  
  pcVar6 = value + -1;
  do {
    pcVar5 = pcVar6;
    bVar2 = pcVar5[1];
    pcVar6 = pcVar5 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
  uVar8 = (ulong)((bVar2 - 0x2b & 0xfd) == 0);
  pbVar7 = pcVar6 + uVar8;
  if ((pcVar6[uVar8] == '0') && ((pcVar5[uVar8 + 2] & 0xdf) == 0x58)) {
    pbVar7 = pcVar5 + uVar8 + 3;
    do {
      bVar9 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar9 == 0x30);
    uVar8 = 0;
    uVar4 = 0;
    do {
      if (bVar9 - 0x30 < 10) {
        uVar4 = uVar4 << 4 | (ulong)(bVar9 - 0x30);
      }
      else {
        if (5 < (bVar9 | 0x20) - 0x61) goto LAB_0010d181;
        uVar4 = uVar4 * 0x10 + (ulong)((bVar9 | 0x20) - 0x57);
      }
      bVar9 = *pbVar7;
      uVar8 = uVar8 + 1;
      pbVar7 = pbVar7 + 1;
    } while( true );
  }
  do {
    bVar9 = *pbVar7;
    pbVar7 = pbVar7 + 1;
  } while (bVar9 == 0x30);
  uVar8 = 0;
  uVar4 = 0;
  bVar10 = bVar9;
  while (bVar10 - 0x30 < 10) {
    pbVar1 = pbVar7 + uVar8;
    uVar8 = uVar8 + 1;
    uVar4 = (ulong)(bVar10 - 0x30) + uVar4 * 10;
    bVar10 = *pbVar1;
  }
  if (0x13 < uVar8) {
    bVar11 = true;
    if (uVar8 != 0x14) goto LAB_0010d199;
    if (0x30 < bVar9) {
      bVar11 = -1 < (long)uVar4 || bVar9 != 0x31;
      goto LAB_0010d199;
    }
  }
  bVar11 = false;
LAB_0010d199:
  if (bVar2 == 0x2d) {
    uVar3 = -uVar4;
    if (-minv < uVar4) {
      uVar3 = minv;
    }
    if (bVar11) {
      uVar3 = minv;
    }
    return uVar3;
  }
  if (maxv <= uVar4) {
    uVar4 = maxv;
  }
  if (bVar11) {
    uVar4 = maxv;
  }
  return uVar4;
LAB_0010d181:
  bVar11 = 0x10 < uVar8;
  goto LAB_0010d199;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}